

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  bool bVar4;
  MemoryManager *local_80;
  XMLCh *tmpBuf_1;
  int additionalLen_1;
  int temp;
  int year;
  int month;
  int day;
  int hour;
  int minute;
  int carry;
  XMLCh *tmpBuf;
  XMLCh *pXStack_38;
  int additionalLen;
  XMLCh *retPtr;
  XMLCh *retBuf;
  MemoryManager *toUse;
  int memLength;
  int utcSize;
  MemoryManager *memMgr_local;
  XMLDateTime *this_local;
  
  toUse._4_4_ = (uint)(this->fValue[7] != 0);
  toUse._0_4_ = toUse._4_4_ + 0xb;
  if ((this->fTimeZone[0] != 0) || (this->fTimeZone[1] != 0)) {
    toUse._0_4_ = toUse._4_4_ + 0x10;
  }
  local_80 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_80 = this->fMemoryManager;
  }
  retBuf = (XMLCh *)local_80;
  _memLength = memMgr;
  memMgr_local = (MemoryManager *)this;
  iVar1 = (*local_80->_vptr_MemoryManager[3])(local_80,(long)(int)toUse << 1);
  pXStack_38 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  retPtr = pXStack_38;
  if (this->fValue[3] < 0xc) {
    iVar1 = fillYearString(this,&stack0xffffffffffffffc8,this->fValue[0]);
    if (iVar1 != 0) {
      pXVar3 = (XMLCh *)(**(code **)(*(long *)retBuf + 0x18))
                                  (retBuf,(long)(iVar1 + (int)toUse) << 1);
      XMLString::moveChars(pXVar3,retPtr,(long)(iVar1 + 4));
      pXStack_38 = pXVar3 + ((long)pXStack_38 - (long)retPtr >> 1);
      (**(code **)(*(long *)retBuf + 0x20))(retBuf,retPtr);
      retPtr = pXVar3;
    }
    *pXStack_38 = L'-';
    pXStack_38 = pXStack_38 + 1;
    fillString(this,&stack0xffffffffffffffc8,this->fValue[1],2);
    *pXStack_38 = L'-';
    pXStack_38 = pXStack_38 + 1;
    fillString(this,&stack0xffffffffffffffc8,this->fValue[2],2);
    if (toUse._4_4_ != 0) {
      if ((this->fTimeZone[0] == 0) && (this->fTimeZone[1] == 0)) {
        *pXStack_38 = L'Z';
        pXStack_38 = pXStack_38 + 1;
      }
      else {
        *pXStack_38 = L'-';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,this->fValue[3],2);
        *pXStack_38 = L':';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,this->fValue[4],2);
      }
    }
    *pXStack_38 = L'\0';
    return retPtr;
  }
  bVar4 = this->fValue[4] != 0;
  if (bVar4) {
    day = 0x3c - this->fValue[4];
  }
  else {
    day = 0;
  }
  hour = (int)bVar4;
  iVar1 = (0x18 - this->fValue[3]) - hour;
  year = this->fValue[2] + 1;
  temp = this->fValue[1];
  additionalLen_1 = this->fValue[0];
  do {
    iVar2 = maxDayInMonthFor(additionalLen_1,temp);
    if (year < 1) {
      iVar2 = maxDayInMonthFor(additionalLen_1,temp + -1);
      hour = -1;
    }
    else {
      if (year <= iVar2) {
        iVar2 = fillYearString(this,&stack0xffffffffffffffc8,additionalLen_1);
        if (iVar2 != 0) {
          pXVar3 = (XMLCh *)(**(code **)(*(long *)retBuf + 0x18))
                                      (retBuf,(long)(iVar2 + (int)toUse) << 1);
          XMLString::moveChars(pXVar3,retPtr,(long)(iVar2 + 4));
          pXStack_38 = pXVar3 + ((long)pXStack_38 - (long)retPtr >> 1);
          (**(code **)(*(long *)retBuf + 0x20))(retBuf,retPtr);
          retPtr = pXVar3;
        }
        *pXStack_38 = L'-';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,temp,2);
        *pXStack_38 = L'-';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,year,2);
        *pXStack_38 = L'+';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,iVar1,2);
        *pXStack_38 = L':';
        pXStack_38 = pXStack_38 + 1;
        fillString(this,&stack0xffffffffffffffc8,day,2);
        *pXStack_38 = L'\0';
        return retPtr;
      }
      iVar2 = -iVar2;
      hour = 1;
    }
    year = iVar2 + year;
    iVar2 = temp + hour;
    temp = modulo(iVar2,1,0xd);
    if (temp < 1) {
      temp = temp + 0xc;
      additionalLen_1 = additionalLen_1 + -1;
    }
    iVar2 = fQuotient(iVar2,1,0xd);
    additionalLen_1 = iVar2 + additionalLen_1;
  } while( true );
}

Assistant:

XMLCh* XMLDateTime::getDateCanonicalRepresentation(MemoryManager* const memMgr) const
{
    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;
    // YYYY-MM-DD  + chNull
    // 1234567890  + 1
    int memLength = 10 + 1 + utcSize;

    if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
        // YYYY-MM-DD+HH:MM  (utcSize will be 1 so drop that)
        // 1234567890123456
        memLength += 5; // 6 - 1 for utcSize
    }

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (memLength) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    if (fValue[Hour] < 12) {

        int additionalLen = fillYearString(retPtr, fValue[CentYear]);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Month], 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Day], 2);

        if (utcSize) {
            if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
                *retPtr++ = UTC_NEG_CHAR;
                fillString(retPtr, fValue[Hour], 2);
                *retPtr++ = TIME_SEPARATOR;
                fillString(retPtr, fValue[Minute], 2);
            }
            else {
                *retPtr++ = UTC_STD_CHAR;
            }
        }
        *retPtr = chNull;
    }
    else {
        /*
         * Need to reconvert things to get a recoverable time zone between
         * +12:00 and -11:59
         */
        int carry;
        int minute;
        int hour;
        int day;
        int month;
        int year;
        if (fValue[Minute] == 0) {
            minute = 0;
            carry = 0;
        }
        else {
            minute = 60 - fValue[Minute];
            carry = 1;
        }
        hour  = 24 - fValue[Hour] - carry;
        day   = fValue[Day] + 1;
        month = fValue[Month];
        year  = fValue[CentYear];

        while (1) {
            int temp = maxDayInMonthFor(year, month);
            if (day < 1) {
                day += maxDayInMonthFor(year, month - 1);
                carry = -1;
            }
            else if (day > temp) {
                day -= temp;
                carry = 1;
            }
            else {
                break;
            }

            temp = month + carry;
            month = modulo(temp, 1, 13);
            if (month <= 0) {
                month+= 12;
                year--;
            }
            year += fQuotient(temp, 1, 13);
        }

        int additionalLen = fillYearString(retPtr, year);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, month, 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, day, 2);

        *retPtr++ = UTC_POS_CHAR;
        fillString(retPtr, hour, 2);
        *retPtr++ = TIME_SEPARATOR;
        fillString(retPtr, minute, 2);
        *retPtr = chNull;
    }
    return retBuf;
}